

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  size_t sVar1;
  ulong uVar2;
  stringstream ss;
  fstream in;
  char *local_3e8;
  long local_3e0;
  char local_3d8 [16];
  stringstream local_3c8 [16];
  long local_3b8 [14];
  ios_base local_348 [264];
  undefined1 local_240 [528];
  
  core_initialization();
  std::fstream::fstream(local_240);
  std::__cxx11::stringstream::stringstream(local_3c8);
  if (1 < argc) {
    uVar2 = 1;
    do {
      __s = argv[uVar2];
      if (__s == (char *)0x0) {
        std::ios::clear((int)(ostream *)local_3b8 + (int)*(undefined8 *)(local_3b8[0] + -0x18));
      }
      else {
        sVar1 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,__s,sVar1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8," ",1);
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  core_query((stringstream *)local_3c8);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_3e8,local_3e0);
  if (local_3e8 != local_3d8) {
    operator_delete(local_3e8);
  }
  std::__cxx11::stringstream::~stringstream(local_3c8);
  std::ios_base::~ios_base(local_348);
  std::fstream::~fstream(local_240);
  return 0;
}

Assistant:

int main(int argc,char *argv[])
{
    core_initialization();
    fstream in;
    stringstream ss;

    #ifdef DEBUG
        string str;
        in.open("query.txt",ios::in);
        while(in.good()){
            in>>str;
            ss<<str<<" ";
        }
    #else
        for(int i=1;i<argc;i++)
            ss<<argv[i]<<" ";
    #endif

    cout<<core_query(ss).str();

    #ifdef WINDOWS
        system("pause");
    #endif
    return 0;
}